

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O0

void BrotliCompressFragmentTwoPassImpl11
               (BrotliTwoPassArena *s,uint8_t *input,size_t input_size,int is_last,
               uint32_t *command_buf,uint8_t *literal_buf,int *table,size_t *storage_ix,
               uint8_t *storage)

{
  int iVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  ulong uVar11;
  char *pcVar12;
  byte bVar13;
  undefined4 in_ECX;
  ulong in_RDX;
  ulong *puVar14;
  long *in_RSI;
  uint *in_R8;
  BrotliTwoPassArena *in_R9;
  bool bVar15;
  long in_stack_00000008;
  size_t *in_stack_00000010;
  uint8_t *in_stack_00000018;
  size_t min_match;
  size_t num_commands;
  size_t num_literals;
  uint8_t *literals;
  uint32_t *commands;
  size_t block_size;
  uint8_t *base_ip;
  uint64_t v;
  uint8_t *p;
  uint32_t insert_1;
  uint32_t prev_hash_1;
  uint32_t cur_hash_1;
  uint64_t input_bytes_1;
  size_t matched_1;
  uint8_t *base_1;
  uint32_t prev_hash;
  uint32_t cur_hash;
  uint64_t input_bytes;
  int insert;
  int distance;
  size_t matched;
  uint8_t *base;
  uint32_t bytes_between_hash_lookups;
  uint32_t hash;
  uint8_t *candidate;
  uint8_t *next_ip;
  uint32_t skip;
  uint32_t next_hash;
  uint8_t *ip_limit;
  size_t len_limit;
  size_t kInputMarginBytes;
  int last_distance;
  uint8_t *next_emit;
  uint8_t *ip_end;
  size_t shift;
  uint8_t *ip;
  uint64_t h_22;
  uint64_t h_1;
  uint64_t h;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  uint32_t extra_4;
  uint32_t extra_3;
  uint32_t extra_2;
  uint32_t extra_1;
  uint32_t code;
  uint32_t nbits_1;
  uint32_t tail_1;
  uint32_t extra;
  uint32_t inscode;
  uint32_t prefix;
  uint32_t nbits;
  uint32_t tail;
  uint32_t extra_18;
  uint32_t extra_17;
  uint32_t extra_16;
  uint32_t extra_15;
  uint32_t code_6;
  uint32_t nbits_9;
  uint32_t tail_8;
  uint32_t extra_14;
  uint32_t inscode_1;
  uint32_t prefix_5;
  uint32_t nbits_8;
  uint32_t tail_7;
  uint32_t extra_13;
  uint32_t distcode_1;
  uint32_t offset_1;
  uint32_t prefix_4;
  uint32_t nbits_7;
  uint32_t d_1;
  uint32_t extra_5;
  uint32_t distcode;
  uint32_t offset;
  uint32_t prefix_1;
  uint32_t nbits_2;
  uint32_t d;
  size_t extra_9;
  size_t extra_8;
  size_t code_3;
  size_t nbits_4;
  size_t tail_4;
  size_t extra_7;
  size_t code_2;
  size_t tail_3;
  size_t extra_6;
  size_t code_1;
  size_t prefix_2;
  size_t nbits_3;
  size_t tail_2;
  uint64_t t_7;
  uint64_t t_6;
  uint64_t t_14;
  uint64_t t_13;
  uint64_t t;
  uint64_t t_1;
  uint64_t t_18;
  uint64_t t_8;
  uint64_t t_15;
  uint64_t t_17;
  uint64_t t_16;
  uint64_t t_10;
  uint64_t t_9;
  uint64_t h_5;
  uint64_t h_4;
  uint64_t h_3;
  uint64_t h_2;
  uint64_t h_15;
  uint64_t h_14;
  uint64_t h_13;
  uint64_t h_12;
  uint64_t h_21;
  uint64_t h_20;
  uint64_t h_19;
  uint64_t h_18;
  uint64_t h_17;
  uint64_t h_16;
  uint64_t h_11;
  uint64_t h_10;
  uint64_t h_9;
  uint64_t h_8;
  uint64_t h_7;
  uint64_t h_6;
  size_t extra_12;
  size_t extra_11;
  size_t code_5;
  size_t nbits_6;
  size_t tail_6;
  size_t extra_10;
  size_t code_4;
  size_t prefix_3;
  size_t nbits_5;
  size_t tail_5;
  uint32_t t_3;
  uint32_t t_2;
  uint32_t t_5;
  uint32_t t_4;
  uint32_t t_12;
  uint32_t t_11;
  uint8_t *in_stack_fffffffffffff628;
  undefined7 in_stack_fffffffffffff630;
  undefined1 in_stack_fffffffffffff637;
  size_t in_stack_fffffffffffff638;
  undefined5 in_stack_fffffffffffff640;
  undefined1 in_stack_fffffffffffff645;
  undefined1 in_stack_fffffffffffff646;
  undefined1 in_stack_fffffffffffff647;
  size_t *in_stack_fffffffffffff658;
  ulong len;
  ulong input_size_00;
  uint32_t *commands_00;
  BrotliTwoPassArena *s_00;
  uint *literals_00;
  undefined4 in_stack_fffffffffffff680;
  BrotliTwoPassArena *local_950;
  uint *local_948;
  size_t local_920;
  ulong local_8f0;
  long *local_8e8;
  uint local_88c;
  uint local_86c;
  long *local_840;
  long *local_838;
  uint local_830;
  uint local_82c;
  int local_80c;
  long *local_808;
  long *local_7f0;
  char *local_6b8;
  ulong *local_6b0;
  ulong *local_6a8;
  char *local_6a0;
  char *local_680;
  ulong *local_678;
  ulong *local_670;
  char *local_668;
  
  commands_00 = (uint32_t *)0x4;
  local_920 = 4;
  s_00 = in_R9;
  literals_00 = in_R8;
  local_8f0 = in_RDX;
  local_8e8 = in_RSI;
  while( true ) {
    if (local_8f0 == 0) {
      return;
    }
    len = local_8f0;
    if (0x1ffff < local_8f0) {
      len = 0x20000;
    }
    plVar8 = (long *)((long)local_8e8 + len);
    local_808 = local_8e8;
    local_80c = -1;
    input_size_00 = len;
    local_950 = in_R9;
    local_948 = in_R8;
    if (0xf < len) break;
LAB_0076777e:
    if (local_808 < plVar8) {
      uVar4 = (int)plVar8 - (int)local_808;
      if (uVar4 < 6) {
        *local_948 = uVar4;
      }
      else if (uVar4 < 0x82) {
        uVar5 = uVar4 - 2;
        iVar7 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        bVar13 = (byte)(iVar7 + -1);
        uVar6 = uVar5 >> (bVar13 & 0x1f);
        *local_948 = (iVar7 + -1) * 2 + uVar6 + 2 | (uVar5 - (uVar6 << (bVar13 & 0x1f))) * 0x100;
      }
      else if (uVar4 < 0x842) {
        uVar5 = uVar4 - 0x42;
        iVar7 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        *local_948 = iVar7 + 10U | (uVar5 - (1 << ((byte)iVar7 & 0x1f))) * 0x100;
      }
      else if (uVar4 < 0x1842) {
        *local_948 = (uVar4 - 0x842) * 0x100 | 0x15;
      }
      else if (uVar4 < 0x5842) {
        *local_948 = (uVar4 - 0x1842) * 0x100 | 0x16;
      }
      else {
        *local_948 = (uVar4 - 0x5842) * 0x100 | 0x17;
      }
      memcpy(local_950,local_808,(ulong)uVar4);
    }
    iVar7 = ShouldCompress(s_00,(uint8_t *)commands_00,input_size_00,
                           (size_t)in_stack_fffffffffffff658);
    if (iVar7 == 0) {
      EmitUncompressedMetaBlock
                ((uint8_t *)
                 CONCAT17(in_stack_fffffffffffff647,
                          CONCAT16(in_stack_fffffffffffff646,
                                   CONCAT15(in_stack_fffffffffffff645,in_stack_fffffffffffff640))),
                 in_stack_fffffffffffff638,
                 (size_t *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
                 in_stack_fffffffffffff628);
    }
    else {
      BrotliStoreMetaBlockHeader(len,0,in_stack_00000010,in_stack_00000018);
      *(ulong *)(in_stack_00000018 + (*in_stack_00000010 >> 3)) =
           0L << ((byte)*in_stack_00000010 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000018 + (*in_stack_00000010 >> 3));
      *in_stack_00000010 = *in_stack_00000010 + 0xd;
      in_stack_fffffffffffff628 = in_stack_00000018;
      StoreCommands((BrotliTwoPassArena *)CONCAT44(in_ECX,in_stack_fffffffffffff680),
                    (uint8_t *)literals_00,(size_t)s_00,commands_00,input_size_00,
                    in_stack_fffffffffffff658,(uint8_t *)0xd);
    }
    local_8e8 = (long *)(len + (long)local_8e8);
    local_8f0 = local_8f0 - len;
  }
  in_stack_fffffffffffff658 = (size_t *)(local_8f0 - 0x10);
  if ((size_t *)(len - 4) < in_stack_fffffffffffff658) {
    in_stack_fffffffffffff658 = (size_t *)(len - 4);
  }
  plVar9 = (long *)((long)local_8e8 + (long)in_stack_fffffffffffff658);
  local_82c = (uint)((ulong)((*(long *)((long)local_8e8 + 1) << 0x20) * 0x1e35a7bd) >> 0x20);
  local_7f0 = (long *)((long)local_8e8 + 1);
  do {
    puVar2 = local_948;
    local_82c = local_82c >> 0x15;
    local_830 = 0x20;
    local_838 = local_7f0;
    plVar10 = local_838;
LAB_0076522c:
    do {
      local_838 = plVar10;
      uVar4 = local_830 + 1;
      plVar10 = (long *)((long)local_838 + (ulong)(local_830 >> 5));
      if (plVar9 < plVar10) goto LAB_0076777e;
      uVar5 = (uint)((ulong)((*plVar10 << 0x20) * 0x1e35a7bd) >> 0x35);
      local_840 = (long *)((long)local_838 - (long)local_80c);
      iVar7 = (int)local_838;
      iVar1 = (int)in_RSI;
      local_830 = uVar4;
      if (((int)*local_838 == (int)*local_840) && (local_840 < local_838)) {
        *(int *)(in_stack_00000008 + (ulong)local_82c * 4) = iVar7 - iVar1;
      }
      else {
        local_840 = (long *)((long)in_RSI + (long)*(int *)(in_stack_00000008 + (ulong)local_82c * 4)
                            );
        *(int *)(in_stack_00000008 + (ulong)local_82c * 4) = iVar7 - iVar1;
        local_82c = uVar5;
        if ((int)*local_838 != (int)*local_840) goto LAB_0076522c;
      }
      local_82c = uVar5;
    } while (0x3fff0 < (long)local_838 - (long)local_840);
    puVar14 = (ulong *)((long)local_840 + 4);
    local_678 = (ulong *)((long)local_838 + 4);
    local_680 = (char *)((long)plVar8 + (-4 - (long)local_838));
    local_670 = puVar14;
LAB_007656a7:
    if (local_680 < (char *)0x8) {
      while( true ) {
        bVar15 = false;
        if (local_680 != (char *)0x0) {
          bVar15 = (char)*local_670 == (char)*local_678;
        }
        if (!bVar15) break;
        local_680 = local_680 + -1;
        local_678 = (ulong *)((long)local_678 + 1);
        local_670 = (ulong *)((long)local_670 + 1);
      }
      local_668 = (char *)((long)local_670 - (long)puVar14);
      in_stack_fffffffffffff647 = 0;
    }
    else {
      uVar11 = *local_678 ^ *local_670;
      local_678 = local_678 + 1;
      if (uVar11 == 0) break;
      iVar3 = 0;
      for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
        iVar3 = iVar3 + 1;
      }
      local_668 = (char *)((long)local_670 + (((ulong)(long)iVar3 >> 3) - (long)puVar14));
    }
    pcVar12 = local_668 + 4;
    iVar3 = iVar7 - (int)local_840;
    uVar4 = iVar7 - (int)local_808;
    local_7f0 = (long *)(pcVar12 + (long)local_838);
    if (uVar4 < 6) {
      *local_948 = uVar4;
    }
    else if (uVar4 < 0x82) {
      uVar5 = uVar4 - 2;
      iVar7 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      bVar13 = (byte)(iVar7 + -1);
      uVar6 = uVar5 >> (bVar13 & 0x1f);
      *local_948 = (iVar7 + -1) * 2 + uVar6 + 2 | (uVar5 - (uVar6 << (bVar13 & 0x1f))) * 0x100;
    }
    else if (uVar4 < 0x842) {
      uVar5 = uVar4 - 0x42;
      iVar7 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      *local_948 = iVar7 + 10U | (uVar5 - (1 << ((byte)iVar7 & 0x1f))) * 0x100;
    }
    else if (uVar4 < 0x1842) {
      *local_948 = (uVar4 - 0x842) * 0x100 | 0x15;
    }
    else if (uVar4 < 0x5842) {
      *local_948 = (uVar4 - 0x1842) * 0x100 | 0x16;
    }
    else {
      *local_948 = (uVar4 - 0x5842) * 0x100 | 0x17;
    }
    memcpy(local_950,local_808,(long)(int)uVar4);
    local_950 = (BrotliTwoPassArena *)((long)local_950->lit_histo + (long)(int)uVar4);
    if (iVar3 == local_80c) {
      local_948[1] = 0x40;
    }
    else {
      uVar4 = iVar3 + 3;
      iVar7 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      bVar13 = (char)iVar7 - 1;
      uVar5 = uVar4 >> (bVar13 & 0x1f) & 1;
      local_948[1] = (iVar7 + -2) * 2 + uVar5 + 0x50 |
                     (uVar4 - (uVar5 + 2 << (bVar13 & 0x1f))) * 0x100;
      local_80c = iVar3;
    }
    local_948 = local_948 + 2;
    if (pcVar12 < (char *)0xc) {
      *local_948 = (int)pcVar12 + 0x14;
      local_948 = puVar2 + 3;
    }
    else if (pcVar12 < (char *)0x48) {
      iVar7 = 0x1f;
      uVar4 = (uint)(local_668 + -4);
      if (uVar4 != 0) {
        for (; uVar4 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      bVar13 = (byte)(iVar7 + -1);
      uVar11 = (ulong)(local_668 + -4) >> (bVar13 & 0x3f);
      *local_948 = (iVar7 + -1) * 2 + (int)uVar11 + 0x1cU |
                   (uVar4 - (int)(uVar11 << (bVar13 & 0x3f))) * 0x100;
      local_948 = puVar2 + 3;
    }
    else {
      if (pcVar12 < (char *)0x88) {
        *local_948 = (int)((ulong)(local_668 + -4) >> 5) + 0x36U |
                     (uint)(((ulong)(local_668 + -4) & 0x1f) << 8);
        puVar2[3] = 0x40;
      }
      else if (pcVar12 < (char *)0x848) {
        uVar4 = (int)local_668 - 0x44;
        iVar7 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        *local_948 = iVar7 + 0x34U | (uVar4 - (int)(1L << ((byte)iVar7 & 0x3f))) * 0x100;
        puVar2[3] = 0x40;
      }
      else {
        *local_948 = ((int)pcVar12 + -0x848) * 0x100 | 0x3f;
        puVar2[3] = 0x40;
      }
      local_948 = puVar2 + 4;
    }
    local_808 = local_7f0;
    if (plVar9 <= local_7f0) goto LAB_0076777e;
    iVar3 = (int)local_7f0;
    uVar11 = *(ulong *)((long)local_7f0 + -3);
    *(int *)(in_stack_00000008 + ((uVar11 << 0x20) * 0x1e35a7bd >> 0x35) * 4) = (iVar3 - iVar1) + -3
    ;
    *(int *)(in_stack_00000008 + (((uVar11 >> 8) << 0x20) * 0x1e35a7bd >> 0x35) * 4) =
         (iVar3 - iVar1) + -2;
    *(int *)(in_stack_00000008 + ((uVar11 << 0x20) * 0x1e35a7bd >> 0x35) * 4) = (iVar3 - iVar1) + -1
    ;
    local_86c = (uint)(((uVar11 >> 0x18) << 0x20) * 0x1e35a7bd >> 0x35);
    iVar7 = *(int *)(in_stack_00000008 + (ulong)local_86c * 4);
    *(int *)(in_stack_00000008 + (ulong)local_86c * 4) = iVar3 - iVar1;
    while( true ) {
      local_840 = (long *)((long)in_RSI + (long)iVar7);
      in_stack_fffffffffffff646 = false;
      if ((long)local_7f0 - (long)local_840 < 0x3fff1) {
        in_stack_fffffffffffff646 = (int)*local_7f0 == (int)*local_840;
      }
      if ((bool)in_stack_fffffffffffff646 == false) break;
      puVar14 = (ulong *)((long)local_840 + 4);
      local_6b0 = (ulong *)((long)local_7f0 + 4);
      local_6b8 = (char *)((long)plVar8 + (-4 - (long)local_7f0));
      local_6a8 = puVar14;
LAB_007669b2:
      if (local_6b8 < (char *)0x8) {
        while( true ) {
          bVar15 = false;
          if (local_6b8 != (char *)0x0) {
            bVar15 = (char)*local_6a8 == (char)*local_6b0;
          }
          if (!bVar15) break;
          local_6b8 = local_6b8 + -1;
          local_6b0 = (ulong *)((long)local_6b0 + 1);
          local_6a8 = (ulong *)((long)local_6a8 + 1);
        }
        local_6a0 = (char *)((long)local_6a8 - (long)puVar14);
        in_stack_fffffffffffff637 = 0;
      }
      else {
        uVar11 = *local_6b0 ^ *local_6a8;
        local_6b0 = local_6b0 + 1;
        if (uVar11 == 0) goto LAB_00766a84;
        iVar7 = 0;
        for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          iVar7 = iVar7 + 1;
        }
        local_6a0 = (char *)((long)local_6a8 + (((ulong)(long)iVar7 >> 3) - (long)puVar14));
      }
      pcVar12 = local_6a0 + 4;
      local_808 = (long *)(pcVar12 + (long)local_7f0);
      local_80c = (int)local_7f0 - (int)local_840;
      if (pcVar12 < (char *)0xa) {
        *local_948 = (int)pcVar12 + 0x26;
      }
      else if (pcVar12 < (char *)0x86) {
        iVar7 = 0x1f;
        uVar4 = (uint)(local_6a0 + -2);
        if (uVar4 != 0) {
          for (; uVar4 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        bVar13 = (byte)(iVar7 + -1);
        uVar11 = (ulong)(local_6a0 + -2) >> (bVar13 & 0x3f);
        *local_948 = (iVar7 + -1) * 2 + (int)uVar11 + 0x2cU |
                     (uVar4 - (int)(uVar11 << (bVar13 & 0x3f))) * 0x100;
      }
      else if (pcVar12 < (char *)0x846) {
        uVar4 = (int)local_6a0 - 0x42;
        iVar7 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        *local_948 = iVar7 + 0x34U | (uVar4 - (int)(1L << ((byte)iVar7 & 0x3f))) * 0x100;
      }
      else {
        *local_948 = ((int)pcVar12 + -0x846) * 0x100 | 0x3f;
      }
      uVar4 = local_80c + 3;
      iVar7 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      bVar13 = (char)iVar7 - 1;
      uVar5 = uVar4 >> (bVar13 & 0x1f) & 1;
      local_948[1] = (iVar7 + -2) * 2 + uVar5 + 0x50 |
                     (uVar4 - (uVar5 + 2 << (bVar13 & 0x1f))) * 0x100;
      local_948 = local_948 + 2;
      in_stack_fffffffffffff638 = local_920;
      if (plVar9 <= local_808) goto LAB_0076777e;
      iVar3 = (int)local_808;
      uVar11 = *(ulong *)((long)local_808 + -3);
      *(int *)(in_stack_00000008 + ((uVar11 << 0x20) * 0x1e35a7bd >> 0x35) * 4) =
           (iVar3 - iVar1) + -3;
      *(int *)(in_stack_00000008 + (((uVar11 >> 8) << 0x20) * 0x1e35a7bd >> 0x35) * 4) =
           (iVar3 - iVar1) + -2;
      *(int *)(in_stack_00000008 + (((uVar11 >> 0x10) << 0x20) * 0x1e35a7bd >> 0x35) * 4) =
           (iVar3 - iVar1) + -1;
      local_88c = (uint)(((uVar11 >> 0x18) << 0x20) * 0x1e35a7bd >> 0x35);
      iVar7 = *(int *)(in_stack_00000008 + (ulong)local_88c * 4);
      *(int *)(in_stack_00000008 + (ulong)local_88c * 4) = iVar3 - iVar1;
      local_7f0 = local_808;
    }
    local_82c = (uint)((ulong)((*(long *)((long)local_7f0 + 1) << 0x20) * 0x1e35a7bd) >> 0x20);
    local_808 = local_7f0;
    local_7f0 = (long *)((long)local_7f0 + 1);
  } while( true );
  local_670 = local_670 + 1;
  local_680 = local_680 + -8;
  goto LAB_007656a7;
LAB_00766a84:
  local_6a8 = local_6a8 + 1;
  local_6b8 = local_6b8 + -8;
  goto LAB_007669b2;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentTwoPass(
    BrotliTwoPassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          s, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}